

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_check.c
# Opt level: O2

_Bool ch_checkfunction(ch_context *vm,ch_primitive value,ch_function **actual)

{
  _Bool _Var1;
  ch_object *object_value;
  
  object_value = (ch_object *)0x0;
  _Var1 = checkobject(vm,value,&object_value);
  if (_Var1) {
    if (object_value->type == TYPE_FUNCTION) {
      *actual = (ch_function *)object_value;
      _Var1 = true;
    }
    else {
      _Var1 = false;
      ch_runtime_error(vm,EXIT_USER_ERROR,"Expected function type, but got object type %d instead");
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool ch_checkfunction(ch_context* vm, ch_primitive value, ch_function** actual) {
	ch_object* object_value = NULL;
	if(!checkobject(vm, value, &object_value)) return false;

	if (!IS_FUNCTION(object_value)) {
		ch_runtime_error(vm, EXIT_USER_ERROR, "Expected function type, but got object type %d instead", object_value->type);
		return false;
	}

	*actual = AS_FUNCTION(object_value);

	return true;
}